

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O2

void helper_pclmulqdq_xmm_x86_64(CPUX86State *env,ZMMReg *d,ZMMReg *s,uint32_t ctrl)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar1 = d->_q_ZMMReg[ctrl & 1];
  uVar3 = 0;
  uVar4 = 0;
  uVar5 = 0;
  for (uVar2 = *(ulong *)((long)s + (ulong)(ctrl >> 1 & 8)); uVar2 != 0; uVar2 = uVar2 >> 1) {
    uVar6 = -(ulong)((uint)uVar2 & 1);
    uVar4 = uVar4 ^ uVar6 & uVar3;
    uVar5 = uVar5 ^ uVar6 & uVar1;
    uVar3 = uVar3 << 1 | uVar1 >> 0x3f;
    uVar1 = uVar1 * 2;
  }
  d->_q_ZMMReg[0] = uVar5;
  d->_q_ZMMReg[1] = uVar4;
  return;
}

Assistant:

void glue(helper_pclmulqdq, SUFFIX)(CPUX86State *env, Reg *d, Reg *s,
                                    uint32_t ctrl)
{
    uint64_t ah, al, b, resh, resl;

    ah = 0;
    al = d->Q((ctrl & 1) != 0);
    b = s->Q((ctrl & 16) != 0);
    resh = resl = 0;

    while (b) {
        if (b & 1) {
            resl ^= al;
            resh ^= ah;
        }
        ah = (ah << 1) | (al >> 63);
        al <<= 1;
        b >>= 1;
    }

    d->Q(0) = resl;
    d->Q(1) = resh;
}